

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O0

void __thiscall
btSimpleBroadphase::aabbTest
          (btSimpleBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax,
          btBroadphaseAabbCallback *callback)

{
  bool bVar1;
  long *plVar2;
  long *in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btVector3 *unaff_retaddr;
  btSimpleBroadphaseProxy *proxy;
  int i;
  int local_24;
  btVector3 *aabbMax1;
  
  aabbMax1 = in_RDI;
  for (local_24 = 0; local_24 <= (int)in_RDI[1].m_floats[0]; local_24 = local_24 + 1) {
    plVar2 = (long *)(*(long *)(in_RDI[1].m_floats + 2) + (long)local_24 * 0x40);
    if ((*plVar2 != 0) &&
       (bVar1 = TestAabbAgainstAabb2(unaff_retaddr,aabbMax1,in_RSI,in_RDX), bVar1)) {
      (**(code **)(*in_RCX + 0x10))(in_RCX,plVar2);
    }
  }
  return;
}

Assistant:

void	btSimpleBroadphase::aabbTest(const btVector3& aabbMin, const btVector3& aabbMax, btBroadphaseAabbCallback& callback)
{
	for (int i=0; i <= m_LastHandleIndex; i++)
	{
		btSimpleBroadphaseProxy* proxy = &m_pHandles[i];
		if(!proxy->m_clientObject)
		{
			continue;
		}
		if (TestAabbAgainstAabb2(aabbMin,aabbMax,proxy->m_aabbMin,proxy->m_aabbMax))
		{
			callback.process(proxy);
		}
	}
}